

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_memorydata_binaryop(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  int iVar3;
  value_type pLVar4;
  value_type pLVar5;
  value_type pLVar6;
  FILE *__stream;
  bool bVar7;
  size_type sVar8;
  reference ppLVar9;
  reference pvVar10;
  size_type sVar11;
  float *pfVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  size_type sVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this_00;
  long in_RDI;
  float scalar_1;
  int op_type_1;
  int memorydata_index_1;
  BinaryOp *binaryop_1;
  Split *split;
  MemoryData *memorydata_1;
  int k;
  size_t j1;
  int split_top_blob_index;
  size_t j0;
  int top_blob_index_1;
  size_t i_1;
  float scalar;
  int op_type;
  int memorydata_index;
  BinaryOp *binaryop;
  MemoryData *memorydata;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  FILE *in_stack_fffffffffffffeb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  vector<int,_std::allocator<int>_> *this_01;
  const_iterator in_stack_fffffffffffffec8;
  int local_94;
  size_type local_90;
  int local_84;
  size_type local_80;
  size_type local_70;
  size_type local_28;
  size_type local_18;
  
  sVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  for (local_18 = 0; local_18 < sVar8; local_18 = local_18 + 1) {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if (!bVar7) {
      ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->tops,0);
      iVar2 = *pvVar10;
      local_28 = local_18;
      do {
        do {
          do {
            local_28 = local_28 + 1;
            if (sVar8 <= local_28) goto LAB_0015a06d;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
          } while (bVar7);
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar11 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->bottoms);
        } while (sVar11 != 2);
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,0);
        if (*pvVar10 == iVar2) break;
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,1);
      } while (*pvVar10 != iVar2);
LAB_0015a06d:
      if (local_28 != sVar8) {
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pLVar4 = *ppLVar9;
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pLVar5 = *ppLVar9;
        if (((*(int *)&pLVar4[1]._vptr_Layer == 1) &&
            (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) &&
           (iVar3._0_1_ = pLVar4[1].one_blob_only, iVar3._1_1_ = pLVar4[1].support_inplace,
           iVar3._2_1_ = pLVar4[1].support_vulkan, iVar3._3_1_ = pLVar4[1].support_packing,
           iVar3 == 0)) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->bottoms,0);
          if (((*pvVar10 == iVar2) && (iVar2 = *(int *)&pLVar5[1]._vptr_Layer, iVar2 != 0)) &&
             ((iVar2 != 2 && ((iVar2 != 4 && (iVar2 != 5)))))) {
            if (iVar2 == 1) {
              *(undefined4 *)&pLVar5[1]._vptr_Layer = 7;
            }
            else {
              if (iVar2 != 3) goto LAB_0015a306;
              *(undefined4 *)&pLVar5[1]._vptr_Layer = 8;
            }
          }
          pfVar12 = ncnn::Mat::operator[]((Mat *)&pLVar4[1].support_tensor_storage,0);
          fVar1 = *pfVar12;
          *(undefined4 *)((long)&pLVar5[1]._vptr_Layer + 4) = 1;
          *(float *)&pLVar5[1].one_blob_only = fVar1;
          __stream = _stderr;
          uVar13 = std::__cxx11::string::c_str();
          uVar14 = std::__cxx11::string::c_str();
          fprintf(__stream,"fuse_memorydata_binaryop %s %s\n",uVar13,uVar14);
          std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffeb8,(difference_type)in_stack_fffffffffffffeb0);
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffeb0,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffea8);
          std::vector<int,_std::allocator<int>_>::erase
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
          std::__cxx11::string::operator=((string *)&pLVar4->type,"ncnnfused");
        }
      }
    }
LAB_0015a306:
  }
  local_70 = 0;
  do {
    if (sVar8 <= local_70) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_70);
    bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if (!bVar7) {
      ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_70);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->tops,0);
      iVar2 = *pvVar10;
      sVar11 = local_70;
      do {
        do {
          do {
            local_90 = sVar11;
            local_80 = local_90 + 1;
            if (sVar8 <= local_80) goto LAB_0015a47a;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_80);
            bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
            sVar11 = local_80;
          } while (bVar7);
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_80);
          sVar15 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->bottoms);
          sVar11 = local_80;
        } while (sVar15 != 1);
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_80);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,0);
        sVar11 = local_80;
      } while (*pvVar10 != iVar2);
LAB_0015a47a:
      if (local_80 != sVar8) {
        local_84 = -1;
        for (local_90 = local_90 + 2; local_90 < sVar8; local_90 = local_90 + 1) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_90);
          bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
          if (!bVar7) {
            ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_90);
            sVar11 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->bottoms);
            if (sVar11 == 2) {
              local_94 = 0;
              while( true ) {
                ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_80);
                sVar11 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->tops);
                if ((int)sVar11 <= local_94) break;
                ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_90);
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,0)
                ;
                iVar2 = *pvVar10;
                ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_80);
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&(*ppLVar9)->tops,(long)local_94);
                if (iVar2 == *pvVar10) {
LAB_0015a640:
                  local_84 = local_94;
                  break;
                }
                ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_90);
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,1)
                ;
                iVar2 = *pvVar10;
                ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_80);
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&(*ppLVar9)->tops,(long)local_94);
                if (iVar2 == *pvVar10) goto LAB_0015a640;
                local_94 = local_94 + 1;
              }
              if (local_84 != -1) break;
            }
          }
        }
        if (local_90 != sVar8) {
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_70);
          pLVar4 = *ppLVar9;
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_80);
          pLVar5 = *ppLVar9;
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_90);
          pLVar6 = *ppLVar9;
          if (((*(int *)&pLVar4[1]._vptr_Layer == 1) &&
              (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) &&
             (iVar2._0_1_ = pLVar4[1].one_blob_only, iVar2._1_1_ = pLVar4[1].support_inplace,
             iVar2._2_1_ = pLVar4[1].support_vulkan, iVar2._3_1_ = pLVar4[1].support_packing,
             iVar2 == 0)) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar6->bottoms,0);
            iVar2 = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pLVar5->tops,(long)local_84);
            if (((iVar2 == *pvVar10) && (iVar2 = *(int *)&pLVar6[1]._vptr_Layer, iVar2 != 0)) &&
               ((iVar2 != 2 && ((iVar2 != 4 && (iVar2 != 5)))))) {
              if (iVar2 == 1) {
                *(undefined4 *)&pLVar6[1]._vptr_Layer = 7;
              }
              else {
                if (iVar2 != 3) goto LAB_0015aa17;
                *(undefined4 *)&pLVar6[1]._vptr_Layer = 8;
              }
            }
            pfVar12 = ncnn::Mat::operator[]((Mat *)&pLVar4[1].support_tensor_storage,0);
            fVar1 = *pfVar12;
            *(undefined4 *)((long)&pLVar6[1]._vptr_Layer + 4) = 1;
            *(float *)&pLVar6[1].one_blob_only = fVar1;
            in_stack_fffffffffffffeb0 = _stderr;
            this_00 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      std::__cxx11::string::c_str();
            uVar13 = std::__cxx11::string::c_str();
            fprintf(in_stack_fffffffffffffeb0,"fuse_memorydata_binaryop %s %s\n",this_00,uVar13);
            this_01 = &pLVar6->bottoms;
            std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (this_00,(difference_type)in_stack_fffffffffffffeb0);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffeb0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffea8);
            std::vector<int,_std::allocator<int>_>::erase(this_01,in_stack_fffffffffffffec8);
            in_stack_fffffffffffffec8._M_current = (int *)&pLVar5->tops;
            std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      (this_00,(difference_type)in_stack_fffffffffffffeb0);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffeb0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffea8);
            std::vector<int,_std::allocator<int>_>::erase(this_01,in_stack_fffffffffffffec8);
            bVar7 = std::vector<int,_std::allocator<int>_>::empty(this_01);
            if (bVar7) {
              std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
              std::__cxx11::string::operator=((string *)&pLVar4->type,"ncnnfused");
            }
            local_70 = local_70 - 1;
          }
        }
      }
    }
LAB_0015aa17:
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_memorydata_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse MemoryData - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == top_blob_index)
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        memorydata->type = "ncnnfused";
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - Split - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j0 = i + 1;
        for (; j0 < layer_count; j0++)
        {
            if (layers[j0]->type != "Split")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (layers[j0]->bottoms[0] == top_blob_index)
                break;
        }

        if (j0 == layer_count)
            continue;

        int split_top_blob_index = -1;

        size_t j1 = j0 + 1;
        for (; j1 < layer_count; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 2)
                continue;

            for (int k = 0; k < (int)layers[j0]->tops.size(); k++)
            {
                if (layers[j1]->bottoms[0] == layers[j0]->tops[k] || layers[j1]->bottoms[1] == layers[j0]->tops[k])
                {
                    split_top_blob_index = k;
                    break;
                }
            }

            if (split_top_blob_index != -1)
                break;
        }

        if (j1 == layer_count)
            continue;

        // fuse MemoryData - Split - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::Split* split = (ncnn::Split*)layers[j0];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j1];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == split->tops[split_top_blob_index])
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        split->tops.erase(split->tops.begin() + split_top_blob_index);
        if (split->tops.empty())
        {
            split->type = "ncnnfused";
            memorydata->type = "ncnnfused";
        }

        i--;
    }

    return 0;
}